

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

Abc_Nam_t * Abc_NamStart(int nObjs,int nAveSize)

{
  uint p;
  int iVar1;
  Abc_Nam_t *pAVar2;
  char *pcVar3;
  int *piVar4;
  
  p = 0x10;
  if (nObjs != 0) {
    p = nObjs;
  }
  pAVar2 = (Abc_Nam_t *)calloc(1,0x50);
  iVar1 = (int)((nAveSize + 1) * p + 0x10) / 4 << 2;
  pAVar2->nStore = iVar1;
  pcVar3 = (char *)malloc((long)iVar1);
  pAVar2->pStore = pcVar3;
  iVar1 = Abc_PrimeCudd(p);
  pAVar2->nBins = iVar1;
  piVar4 = (int *)calloc((long)iVar1,4);
  pAVar2->pBins = piVar4;
  Vec_IntGrow(&pAVar2->vInt2Handle,p);
  Vec_IntPush(&pAVar2->vInt2Handle,-1);
  Vec_IntGrow(&pAVar2->vInt2Next,p);
  Vec_IntPush(&pAVar2->vInt2Next,-1);
  pAVar2->iHandle = 4;
  pcVar3 = pAVar2->pStore;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pAVar2->nRefs = 1;
  return pAVar2;
}

Assistant:

Abc_Nam_t * Abc_NamStart( int nObjs, int nAveSize )
{
    Abc_Nam_t * p;
    if ( nObjs == 0 )
        nObjs = 16;
    p = ABC_CALLOC( Abc_Nam_t, 1 );
    p->nStore      = ((nObjs * (nAveSize + 1) + 16) / 4) * 4;
    p->pStore      = ABC_ALLOC( char, p->nStore );
    p->nBins       = Abc_PrimeCudd( nObjs );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    // 0th object is unused
    Vec_IntGrow( &p->vInt2Handle, nObjs );  Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntGrow( &p->vInt2Next,   nObjs );  Vec_IntPush( &p->vInt2Next,   -1 );
    p->iHandle     = 4;
    memset( p->pStore, 0, 4 );
//Abc_Print( 1, "Starting nam with %d bins.\n", p->nBins );
    // start reference counting
    p->nRefs       = 1;
    return p;
}